

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O3

void DupWhileImplementation(bool isWhile)

{
  bool bVar1;
  int iVar2;
  CStringsList *this;
  size_t sVar3;
  CStringsList *pCVar4;
  _Elt_pointer pSVar5;
  char *stringSource;
  char *pcVar6;
  aint val;
  char *expressionSource;
  CStringsList *condition;
  char *guardianSource;
  aint local_34;
  CStringsList *local_30;
  CStringsList *local_28;
  CStringsList *local_20;
  
  local_34 = 0;
  local_28 = (CStringsList *)0x0;
  if (RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur !=
      RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
      super__Deque_impl_data._M_start._M_cur) {
    pSVar5 = RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pSVar5 = RepeatStack.c.super__Deque_base<SRepeatStack,_std::allocator<SRepeatStack>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 8;
    }
    if (pSVar5[-1].IsInWork == false) {
      SkipToEol(&lp);
      pSVar5[-1].Level = pSVar5[-1].Level + 1;
      return;
    }
  }
  if (isWhile) {
    this = (CStringsList *)operator_new(0x28);
    CStringsList::CStringsList(this,lp,(CStringsList *)0x0);
    pCVar4 = (CStringsList *)this->string;
    local_28 = this;
    sVar3 = strlen((char *)pCVar4);
    lp = lp + sVar3;
    local_30 = pCVar4;
    iVar2 = ParseExpressionNoSyntaxError((char **)&local_30,&local_34);
    if (iVar2 == 0) {
      local_34 = 0x186a1;
LAB_001123a0:
      Error("[WHILE] Syntax error in <expression>",this->string,SUPPRESS);
      free(this->string);
      pcVar6 = strdup("0");
      this->string = pcVar6;
      local_34 = 1;
    }
    else if ((*(char *)&local_30->string == '\0') || (bVar1 = comma((char **)&local_30), !bVar1)) {
      local_34 = 0x186a1;
    }
    else {
      local_20 = local_30;
      iVar2 = ParseExpressionNoSyntaxError((char **)&local_20,&local_34);
      if (iVar2 == 0) goto LAB_001123a0;
      if (local_30[-1].source.field_0x17 != ',') {
        __assert_fail("\',\' == expressionSource[-1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/z00m128[P]sjasmplus/sjasm/directives.cpp"
                      ,0x74c,"void DupWhileImplementation(bool)");
      }
      local_30[-1].source.field_0x17 = 0;
      local_34 = local_34 + 1;
    }
    goto LAB_001123d3;
  }
  IsLabelNotFound = false;
  iVar2 = ParseExpressionNoSyntaxError(&lp,&local_34);
  if (iVar2 == 0) {
    pcVar6 = "[DUP/REPT] Syntax error in <count>";
    goto LAB_00112432;
  }
  if (IsLabelNotFound == true) {
    Error("[DUP/REPT] Forward reference",(char *)0x0,ALL);
  }
  if (local_34 < 0) {
    ErrorInt("[DUP/REPT] Repeat value must be positive or zero",local_34,IF_FIRST);
    return;
  }
  bVar1 = comma(&lp);
  if (bVar1) {
    pcVar6 = GetID(&lp);
    if (pcVar6 == (char *)0x0) {
      Error("[DUP/REPT] invalid index variable name",lp,IF_FIRST);
      SkipToEol(&lp);
      goto LAB_001123d3;
    }
  }
  else {
LAB_001123d3:
    pcVar6 = (char *)0x0;
  }
  pCVar4 = (CStringsList *)operator_new(0x28);
  stringSource = "";
  if (pcVar6 != (char *)0x0) {
    stringSource = pcVar6;
  }
  CStringsList::CStringsList(pCVar4,stringSource,(CStringsList *)0x0);
  local_30 = pCVar4;
  std::deque<SRepeatStack,std::allocator<SRepeatStack>>::
  emplace_back<int&,CStringsList*&,CStringsList*>
            ((deque<SRepeatStack,std::allocator<SRepeatStack>> *)&RepeatStack,&local_34,&local_28,
             &local_30);
  iVar2 = SkipBlanks();
  if (iVar2 != 0) {
    return;
  }
  pcVar6 = "[DUP] unexpected chars";
LAB_00112432:
  Error(pcVar6,lp,SUPPRESS);
  return;
}

Assistant:

static void DupWhileImplementation(bool isWhile) {
	aint val = 0;
	CStringsList* condition = nullptr;

	if (!RepeatStack.empty()) {
		SRepeatStack& dup = RepeatStack.top();
		if (!dup.IsInWork) {
			SkipToEol(lp);		// Just skip the expression to the end of line, don't evaluate yet
			++dup.Level;
			return;
		}
	}

	const char* indexVar = nullptr;
	if (isWhile) {
		condition = new CStringsList(lp);
		if (nullptr == condition) ErrorOOM();
		lp += strlen(condition->string);
		// scan condition string for extra guardian value, and split + parse it as needed
		char* expressionSource = condition->string;
		bool parseOk = ParseExpressionNoSyntaxError(expressionSource, val);
		if (parseOk && *expressionSource && comma(expressionSource)) {
			// comma found, try to parse explicit guardian value
			char* guardianSource = expressionSource;
			parseOk = parseOk && ParseExpressionNoSyntaxError(guardianSource, val);
			// overwrite the comma to keep only condition string without guardian argument
			if (parseOk) {
				assert(',' == expressionSource[-1]);
				expressionSource[-1] = 0;
				++val;		// +1 to explicit value to report error when WHILE does *over* that
			}
		} else {
			val = 100001;	// default guardian value is 100k
		}
		if (!parseOk) {
			Error("[WHILE] Syntax error in <expression>", condition->string, SUPPRESS);
			free(condition->string);			// release original string
			condition->string = STRDUP("0");	// force it to evaluate to zero
			val = 1;
		}
	} else {
		IsLabelNotFound = false;
		if (!ParseExpressionNoSyntaxError(lp, val)) {
			Error("[DUP/REPT] Syntax error in <count>", lp, SUPPRESS);
			return;
		}
		if (IsLabelNotFound) {
			Error("[DUP/REPT] Forward reference", NULL, ALL);
		}
		if ((int) val < 0) {
			ErrorInt("[DUP/REPT] Repeat value must be positive or zero", val, IF_FIRST); return;
		}
		if (comma(lp)) {
			indexVar = GetID(lp);
			if (nullptr == indexVar) {
				Error("[DUP/REPT] invalid index variable name", lp, IF_FIRST);
				SkipToEol(lp);
			}
		}
	}

	RepeatStack.emplace(val, condition, new CStringsList(indexVar ? indexVar : ""));
	if (!SkipBlanks()) Error("[DUP] unexpected chars", lp, SUPPRESS);
}